

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderLoopTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ShaderLoopTests::init(ShaderLoopTests *this,EVP_PKEY_CTX *ctx)

{
  DataType dataType;
  char *__s;
  char *pcVar1;
  TestContext *pTVar2;
  LoopCountType loopCountType;
  uint uVar3;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  char *pcVar4;
  char *__rhs;
  char *pcVar5;
  ostream *poVar6;
  LoopUniformSetup *this_00;
  TestNode *node_03;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  Precision precision;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar12;
  string *this_01;
  ostringstream *poVar13;
  ostringstream *poVar14;
  LoopType loopType;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  uint local_5f4;
  string iterMaxStr;
  string loopBody;
  int numLoopIters;
  StringTemplate fragTemplate;
  string incrementStr;
  string loopCountDeclStr;
  string initValue;
  string loopCmpStr;
  vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_> uniformInformations;
  StringTemplate vertTemplate;
  string vertexShaderSource;
  string groupDesc;
  string groupName;
  string testDesc;
  string testName;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  ostringstream frag;
  ostringstream vtx;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"generic",
             "Generic loop tests.");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"special"
             ,"Special loop tests.");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  lVar10 = 0;
  do {
    if (lVar10 == 3) {
      return 0xbff530;
    }
    __s = (char *)(&sr::(anonymous_namespace)::
                    getLoopTypeName(vkt::sr::(anonymous_namespace)::LoopType)::s_names)[lVar10];
    lVar9 = 0;
    while( true ) {
      if (lVar9 == 3) break;
      pcVar1 = (char *)(&sr::(anonymous_namespace)::
                         getLoopCountTypeName(vkt::sr::(anonymous_namespace)::LoopCountType)::
                         s_names)[lVar9];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertTemplate,__s,(allocator<char> *)&iterMaxStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vertTemplate,"_");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar1,(allocator<char> *)&initValue);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params);
      std::operator+(&groupName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                     "_iterations");
      std::__cxx11::string::~string((string *)&vtx);
      std::__cxx11::string::~string((string *)&params);
      std::__cxx11::string::~string((string *)&frag);
      std::__cxx11::string::~string((string *)&vertTemplate);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frag,"Loop tests with ",(allocator<char> *)&vertTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     pcVar1);
      std::operator+(&groupDesc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                     " loop counter.");
      std::__cxx11::string::~string((string *)&vtx);
      std::__cxx11::string::~string((string *)&frag);
      node_01 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node_01,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 groupName._M_dataplus._M_p,groupDesc._M_dataplus._M_p);
      node_02 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node_02,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 groupName._M_dataplus._M_p,groupDesc._M_dataplus._M_p);
      tcu::TestNode::addChild(node,node_01);
      tcu::TestNode::addChild(node_00,node_02);
      loopCountType = (LoopCountType)lVar9;
      local_5f4 = loopCountType - LOOPCOUNT_UNIFORM;
      for (precision = PRECISION_MEDIUMP; loopType = (LoopType)lVar10, precision != PRECISION_LAST;
          precision = precision + PRECISION_MEDIUMP) {
        pcVar4 = glu::getPrecisionName(precision);
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          dataType = init::s_countDataType[lVar8];
          __rhs = glu::getDataTypeName(dataType);
          uVar3 = dataType - TYPE_INT;
          lVar7 = 0;
          while( true ) {
            if (lVar7 == 8) break;
            pcVar5 = glu::getShaderTypeName
                               (*(ShaderType *)
                                 ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::
                                        primitiveTypes + lVar7));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&iterMaxStr,"basic_",(allocator<char> *)&initValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&iterMaxStr,pcVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &frag,"_");
            std::operator+(&testName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ,pcVar5);
            std::__cxx11::string::~string((string *)&vtx);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCmpStr,__s,(allocator<char> *)&incrementStr);
            std::operator+(&loopCountDeclStr,&loopCmpStr," loop with ");
            std::operator+(&initValue,&loopCountDeclStr,pcVar4);
            std::operator+(&iterMaxStr,&initValue,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&iterMaxStr," ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,pcVar1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate," iteration count in ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &frag,pcVar5);
            std::operator+(&testDesc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ," shader.");
            std::__cxx11::string::~string((string *)&vtx);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::string::~string((string *)&initValue);
            std::__cxx11::string::~string((string *)&loopCountDeclStr);
            std::__cxx11::string::~string((string *)&loopCmpStr);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_380,testName._M_dataplus._M_p,&local_5f5);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a0,testDesc._M_dataplus._M_p,&local_5f6);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            poVar14 = (ostringstream *)&frag;
            if (lVar7 == 0) {
              poVar14 = (ostringstream *)&vtx;
            }
            std::operator<<((ostream *)&vtx,"#version 310 es\n");
            std::operator<<((ostream *)&frag,"#version 310 es\n");
            std::operator<<((ostream *)&vtx,"layout(location=0) in highp vec4 a_position;\n");
            std::operator<<((ostream *)&vtx,"layout(location=1) in highp vec4 a_coords;\n");
            std::operator<<((ostream *)&frag,"layout(location=0) out mediump vec4 o_color;\n");
            if (lVar9 == 2) {
              std::operator<<((ostream *)&vtx,"layout(location=3) in mediump float a_one;\n");
            }
            if (lVar7 == 0) {
              std::operator<<((ostream *)&vtx,"layout(location=0) out mediump vec3 v_color;\n");
              pcVar5 = "layout(location=0) in mediump vec3 v_color;\n";
LAB_005a2636:
              std::operator<<((ostream *)&frag,pcVar5);
            }
            else {
              std::operator<<((ostream *)&vtx,"layout(location=0) out mediump vec4 v_coords;\n");
              std::operator<<((ostream *)&frag,"layout(location=0) in mediump vec4 v_coords;\n");
              if (lVar9 == 2) {
                std::operator<<((ostream *)&vtx,"layout(location=1) out mediump float v_one;\n");
                pcVar5 = "layout(location=1) in mediump float v_one;\n";
                goto LAB_005a2636;
              }
            }
            uniformInformations.
            super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            numLoopIters = 3;
            uniformInformations.
            super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            uniformInformations.
            super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if (uVar3 < 4) {
              if (local_5f4 < 2) {
                poVar6 = std::operator<<((ostream *)poVar14,"layout(std140, set=0, binding=");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                poVar6 = std::operator<<(poVar6,") uniform buff");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::operator<<(poVar6," {\n");
                poVar6 = std::operator<<((ostream *)poVar14," ${COUNTER_PRECISION} int ");
                poVar6 = std::operator<<(poVar6,"ui_three");
                std::operator<<(poVar6,";\n");
                std::operator<<((ostream *)poVar14,"};\n");
                vertTemplate.m_template._M_dataplus._M_p._0_4_ = 7;
                std::vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
                emplace_back<vkt::sr::BaseUniformType>
                          (&uniformInformations,(BaseUniformType *)&vertTemplate);
              }
            }
            else {
              if (local_5f4 < 2) {
                poVar6 = std::operator<<((ostream *)poVar14,"layout(std140, set=0, binding=");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                poVar6 = std::operator<<(poVar6,") uniform buff");
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                std::operator<<(poVar6," {\n");
                poVar6 = std::operator<<((ostream *)poVar14,"\t${COUNTER_PRECISION} float ");
                poVar6 = std::operator<<(poVar6,"uf_third");
                std::operator<<(poVar6,";\n");
                std::operator<<((ostream *)poVar14,"};\n");
                vertTemplate.m_template._M_dataplus._M_p._0_4_ = 0x2d;
                std::vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
                emplace_back<vkt::sr::BaseUniformType>
                          (&uniformInformations,(BaseUniformType *)&vertTemplate);
              }
              poVar6 = std::operator<<((ostream *)poVar14,"layout(std140, set=0, binding=");
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              poVar6 = std::operator<<(poVar6,") uniform buff");
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::operator<<(poVar6," {\n");
              std::operator<<((ostream *)poVar14,"\t${COUNTER_PRECISION} float uf_one;\n");
              std::operator<<((ostream *)poVar14,"};\n");
              vertTemplate.m_template._M_dataplus._M_p._0_4_ = 0x24;
              std::vector<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
              emplace_back<vkt::sr::BaseUniformType>
                        (&uniformInformations,(BaseUniformType *)&vertTemplate);
            }
            std::operator<<((ostream *)&vtx,"\n");
            std::operator<<((ostream *)&vtx,"void main()\n");
            std::operator<<((ostream *)&vtx,"{\n");
            std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
            std::operator<<((ostream *)&frag,"\n");
            std::operator<<((ostream *)&frag,"void main()\n");
            std::operator<<((ostream *)&frag,"{\n");
            pcVar5 = "\t${PRECISION} vec4 coords = v_coords;\n";
            if (lVar7 == 0) {
              pcVar5 = "\t${PRECISION} vec4 coords = a_coords;\n";
            }
            std::operator<<((ostream *)poVar14,pcVar5);
            if (lVar9 == 2) {
              pcVar5 = "\t${COUNTER_PRECISION} int one = int(v_one + 0.5);\n";
              if (lVar7 == 0) {
                pcVar5 = "\t${COUNTER_PRECISION} int one = int(a_one + 0.5);\n";
              }
              pcVar11 = "\t${COUNTER_PRECISION} float one = v_one;\n";
              if (lVar7 == 0) {
                pcVar11 = "\t${COUNTER_PRECISION} float one = a_one;\n";
              }
              if (uVar3 < 4) {
                pcVar11 = pcVar5;
              }
              std::operator<<((ostream *)poVar14,pcVar11);
            }
            std::operator<<((ostream *)poVar14,"\t${PRECISION} vec4 res = coords;\n");
            iterMaxStr._M_string_length = 0;
            iterMaxStr._M_dataplus._M_p = (pointer)&iterMaxStr.field_2;
            iterMaxStr.field_2._M_local_buf[0] = '\0';
            if (uVar3 < 4) {
              if (loopCountType == LOOPCOUNT_UNIFORM) {
                std::__cxx11::string::assign((char *)&iterMaxStr);
                pcVar5 = "0";
              }
              else {
                if (loopCountType == LOOPCOUNT_CONSTANT) {
                  de::toString<int>((string *)&vertTemplate,&numLoopIters);
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&vertTemplate);
                  ppVar12 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&vertTemplate;
                }
                else {
                  pcVar5 = "0";
                  if (lVar9 != 2) goto LAB_005a2a56;
                  ppVar12 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&params;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)ppVar12,"ui_three",(allocator<char> *)&initValue);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ppVar12,"*one");
                  std::__cxx11::string::operator=((string *)&iterMaxStr,(string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                }
                std::__cxx11::string::~string((string *)ppVar12);
                pcVar5 = "0";
              }
            }
            else if (((loopCountType == LOOPCOUNT_CONSTANT) || (loopCountType == LOOPCOUNT_UNIFORM))
                    || (pcVar5 = "0.05", lVar9 == 2)) {
              std::__cxx11::string::assign((char *)&iterMaxStr);
              pcVar5 = "0.05";
            }
LAB_005a2a56:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&initValue,pcVar5,(allocator<char> *)&vertTemplate);
            std::operator+(&loopCountDeclStr,"${COUNTER_PRECISION} ${LOOP_VAR_TYPE} ndx = ",
                           &initValue);
            std::operator+(&loopCmpStr,"ndx < ",&iterMaxStr);
            incrementStr._M_string_length = 0;
            incrementStr._M_dataplus._M_p = (pointer)&incrementStr.field_2;
            incrementStr.field_2._M_local_buf[0] = '\0';
            if (uVar3 < 4) {
              std::__cxx11::string::assign((char *)&incrementStr);
            }
            else {
              if (loopCountType == LOOPCOUNT_UNIFORM) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&params,"ndx += ",(allocator<char> *)&loopBody);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"uf_third");
                std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                ppVar12 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vertTemplate;
LAB_005a2b98:
                this_01 = (string *)&params;
                std::__cxx11::string::~string((string *)ppVar12);
              }
              else {
                if (loopCountType == LOOPCOUNT_CONSTANT) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&params,"ndx += ",(allocator<char> *)&vertexShaderSource);
                  fragTemplate.m_template._M_dataplus._M_p._0_4_ = 0x3eaaaaab;
                  de::toString<float>(&loopBody,(float *)&fragTemplate);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&params,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&loopBody);
                  std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                  std::__cxx11::string::~string((string *)&vertTemplate);
                  ppVar12 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&loopBody;
                  goto LAB_005a2b98;
                }
                if (lVar9 != 2) goto LAB_005a2ba5;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&loopBody,"ndx += ",(allocator<char> *)&fragTemplate);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,&loopBody,"uf_third");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"*one");
                std::__cxx11::string::operator=((string *)&incrementStr,(string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&params);
                this_01 = &loopBody;
              }
              std::__cxx11::string::~string((string *)this_01);
            }
LAB_005a2ba5:
            loopBody._M_dataplus._M_p = (pointer)&loopBody.field_2;
            loopBody._M_string_length = 0;
            loopBody.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::assign((char *)&loopBody);
            if (loopType == LOOPTYPE_DO_WHILE) {
              poVar6 = std::operator<<((ostream *)poVar14,"\t");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,&loopCountDeclStr,";\n");
              std::operator<<(poVar6,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::operator<<((ostream *)poVar14,"\tdo\n");
              std::operator<<((ostream *)poVar14,"\t{\n");
              std::operator<<((ostream *)poVar14,(string *)&loopBody);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t\t",&incrementStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,";\n");
              std::operator<<((ostream *)poVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"\t} while (",&loopCmpStr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,");\n");
              std::operator<<((ostream *)poVar14,(string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
            }
            else {
              if (loopType == LOOPTYPE_WHILE) {
                poVar6 = std::operator<<((ostream *)poVar14,"\t");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,&loopCountDeclStr,";\n");
                std::operator<<(poVar6,(string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&vertTemplate);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"\twhile (",&loopCmpStr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,")\n");
                std::operator<<((ostream *)poVar14,(string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&params);
                std::operator<<((ostream *)poVar14,"\t{\n");
                std::operator<<((ostream *)poVar14,(string *)&loopBody);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,"\t\t",&incrementStr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,";\n");
                std::operator<<((ostream *)poVar14,(string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&params);
              }
              else {
                if (loopType != LOOPTYPE_FOR) goto LAB_005a2eff;
                std::operator+(&local_360,"\tfor (",&loopCountDeclStr);
                std::operator+(&local_340,&local_360,"; ");
                std::operator+(&vertexShaderSource,&local_340,&loopCmpStr);
                std::operator+(&fragTemplate.m_template,&vertexShaderSource,"; ");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,&fragTemplate.m_template,&incrementStr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vertTemplate,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &params,")\n");
                std::operator<<((ostream *)poVar14,(string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&vertTemplate);
                std::__cxx11::string::~string((string *)&params);
                std::__cxx11::string::~string((string *)&fragTemplate);
                std::__cxx11::string::~string((string *)&vertexShaderSource);
                std::__cxx11::string::~string((string *)&local_340);
                std::__cxx11::string::~string((string *)&local_360);
                std::operator<<((ostream *)poVar14,"\t{\n");
                std::operator<<((ostream *)poVar14,(string *)&loopBody);
              }
              std::operator<<((ostream *)poVar14,"\t}\n");
            }
LAB_005a2eff:
            if (lVar7 == 0) {
              std::operator<<((ostream *)&vtx,"\tv_color = res.rgb;\n");
              poVar13 = &frag;
              pcVar5 = "\to_color = vec4(v_color.rgb, 1.0);\n";
LAB_005a2f6a:
              std::operator<<((ostream *)poVar13,pcVar5);
            }
            else {
              std::operator<<((ostream *)&vtx,"\tv_coords = a_coords;\n");
              std::operator<<((ostream *)&frag,"\to_color = vec4(res.rgb, 1.0);\n");
              poVar13 = &vtx;
              pcVar5 = "\tv_one = a_one;\n";
              if (lVar9 == 2) goto LAB_005a2f6a;
            }
            std::operator<<((ostream *)&vtx,"}\n");
            std::operator<<((ostream *)&frag,"}\n");
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[14],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [14])"LOOP_VAR_TYPE",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x9b7ddf,(char (*) [8])0x9f45aa);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            fragTemplate.m_template._M_dataplus._M_p = glu::getPrecisionName(precision);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[18],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [18])"COUNTER_PRECISION",(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&vertTemplate);
            std::__cxx11::stringbuf::str();
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            std::__cxx11::string::~string((string *)&fragTemplate.m_template);
            std::__cxx11::stringbuf::str();
            tcu::StringTemplate::StringTemplate
                      ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_340,&fragTemplate,&params);
            this_00 = (LoopUniformSetup *)operator_new(0x28);
            LoopUniformSetup::LoopUniformSetup(this_00,&uniformInformations);
            node_03 = (TestNode *)operator_new(0xe0);
            ShaderLoopCase::ShaderLoopCase
                      ((ShaderLoopCase *)node_03,pTVar2,&local_380,&local_3a0,lVar7 == 0,
                       evalLoop3Iters,(UniformSetup *)this_00,&vertexShaderSource,&local_340);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::string::~string((string *)&vertexShaderSource);
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            std::__cxx11::string::~string((string *)&loopBody);
            std::__cxx11::string::~string((string *)&incrementStr);
            std::__cxx11::string::~string((string *)&loopCmpStr);
            std::__cxx11::string::~string((string *)&loopCountDeclStr);
            std::__cxx11::string::~string((string *)&initValue);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::_Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>::
            ~_Vector_base(&uniformInformations.
                           super__Vector_base<vkt::sr::BaseUniformType,_std::allocator<vkt::sr::BaseUniformType>_>
                         );
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_380);
            tcu::TestNode::addChild(node_01,node_03);
            std::__cxx11::string::~string((string *)&testDesc);
            std::__cxx11::string::~string((string *)&testName);
            lVar7 = lVar7 + 4;
          }
        }
      }
      for (lVar8 = 0; lVar8 != 0x1a; lVar8 = lVar8 + 1) {
        if (lVar8 != 7 || lVar10 != 2) {
          pcVar1 = *(char **)(sr::(anonymous_namespace)::
                              getLoopCaseName(vkt::sr::(anonymous_namespace)::LoopCase)::s_names +
                             lVar8 * 8);
          lVar7 = 0;
          while( true ) {
            if (lVar7 == 8) break;
            pcVar4 = glu::getShaderTypeName
                               (*(ShaderType *)
                                 ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::
                                        primitiveTypes + lVar7));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertTemplate,pcVar1,(allocator<char> *)&params);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &frag,pcVar4);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&loopCountDeclStr,pcVar1,(allocator<char> *)&loopCmpStr);
            std::operator+(&initValue,&loopCountDeclStr," loop with ");
            std::operator+(&iterMaxStr,&initValue,__s);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,&iterMaxStr," iteration count in ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vertTemplate,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params,pcVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vertTemplate," shader.");
            std::__cxx11::string::~string((string *)&vertTemplate);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&iterMaxStr);
            std::__cxx11::string::~string((string *)&initValue);
            std::__cxx11::string::~string((string *)&loopCountDeclStr);
            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertTemplate,_vtx,(allocator<char> *)&initValue);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,_frag,(allocator<char> *)&loopCountDeclStr);
            createSpecialLoopCase
                      ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderLoopCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderLoopCase>_>
                        *)&iterMaxStr,pTVar2,(string *)&vertTemplate,(string *)&params,lVar7 == 0,
                       (LoopCase)lVar8,loopType,loopCountType);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&vertTemplate);
            tcu::TestNode::addChild(node_02,(TestNode *)iterMaxStr._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&frag);
            std::__cxx11::string::~string((string *)&vtx);
            lVar7 = lVar7 + 4;
          }
        }
      }
      std::__cxx11::string::~string((string *)&groupDesc);
      std::__cxx11::string::~string((string *)&groupName);
      lVar9 = lVar9 + 1;
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void ShaderLoopTests::init (void)
{
	// Loop cases.

	static const glu::ShaderType s_shaderTypes[] =
	{
		glu::SHADERTYPE_VERTEX,
		glu::SHADERTYPE_FRAGMENT
	};

	static const glu::DataType s_countDataType[] =
	{
		glu::TYPE_INT,
		glu::TYPE_FLOAT
	};

	TestCaseGroup* genericGroup = new TestCaseGroup(m_testCtx, "generic", "Generic loop tests.");
	TestCaseGroup* specialGroup = new TestCaseGroup(m_testCtx, "special", "Special loop tests.");
	addChild(genericGroup);
	addChild(specialGroup);

	for (int loopType = 0; loopType < LOOPTYPE_LAST; loopType++)
	{
		const char* loopTypeName = getLoopTypeName((LoopType)loopType);

		for (int loopCountType = 0; loopCountType < LOOPCOUNT_LAST; loopCountType++)
		{
			const char* loopCountName = getLoopCountTypeName((LoopCountType)loopCountType);

			std::string groupName = std::string(loopTypeName) + "_" + std::string(loopCountName) + "_iterations";
			std::string groupDesc = std::string("Loop tests with ") + loopCountName + " loop counter.";
			TestCaseGroup* genericSubGroup = new TestCaseGroup(m_testCtx, groupName.c_str(), groupDesc.c_str());
			TestCaseGroup* specialSubGroup = new TestCaseGroup(m_testCtx, groupName.c_str(), groupDesc.c_str());
			genericGroup->addChild(genericSubGroup);
			specialGroup->addChild(specialSubGroup);

			// Generic cases.

			for (int precision = glu::PRECISION_MEDIUMP; precision < glu::PRECISION_LAST; precision++)
			{
				const char* precisionName = getPrecisionName((glu::Precision)precision);

				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_countDataType); dataTypeNdx++)
				{
					glu::DataType loopDataType = s_countDataType[dataTypeNdx];
					const char* dataTypeName = getDataTypeName(loopDataType);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						glu::ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char*	shaderTypeName	= getShaderTypeName(shaderType);
						bool		isVertexCase	= (shaderType == glu::SHADERTYPE_VERTEX);

						std::string testName = std::string("basic_") + precisionName + "_" + dataTypeName + "_" + shaderTypeName;
						std::string testDesc = std::string(loopTypeName) + " loop with " + precisionName + dataTypeName + " " + loopCountName + " iteration count in " + shaderTypeName + " shader.";
						de::MovePtr<ShaderLoopCase> testCase(createGenericLoopCase(m_testCtx, testName.c_str(), testDesc.c_str(), isVertexCase, (LoopType)loopType, (LoopCountType)loopCountType, (glu::Precision)precision, loopDataType));
						genericSubGroup->addChild(testCase.release());
					}
				}
			}

			// Special cases.

			for (int loopCase = 0; loopCase < LOOPCASE_LAST; loopCase++)
			{
				const char* loopCaseName = getLoopCaseName((LoopCase)loopCase);

				// no-iterations not possible with do-while.
				if ((loopCase == LOOPCASE_NO_ITERATIONS) && (loopType == LOOPTYPE_DO_WHILE))
					continue;

				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					glu::ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					bool		isVertexCase	= (shaderType == glu::SHADERTYPE_VERTEX);

					std::string name = std::string(loopCaseName) + "_" + shaderTypeName;
					std::string desc = std::string(loopCaseName) + " loop with " + loopTypeName + " iteration count in " + shaderTypeName + " shader.";
					de::MovePtr<ShaderLoopCase> testCase(createSpecialLoopCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, (LoopCase)loopCase, (LoopType)loopType, (LoopCountType)loopCountType));
					specialSubGroup->addChild(testCase.release());
				}
			}
		}
	}
}